

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

any __thiscall
cs_impl::any::make_protect<cs::type_t,cs::struct_builder_const&,cs::type_id_const&>
          (any *this,struct_builder *args,type_id *args_1)

{
  proxy *ppVar1;
  int local_28;
  int local_24;
  holder<cs::type_t> *local_20;
  
  local_28 = 1;
  local_24 = local_28;
  local_20 = cs::
             allocator_type<cs_impl::any::holder<cs::type_t>,64ul,cs_impl::default_allocator_provider>
             ::alloc<cs::struct_builder_const&,cs::type_id_const&>
                       ((allocator_type<cs_impl::any::holder<cs::type_t>,64ul,cs_impl::default_allocator_provider>
                         *)holder<cs::type_t>::allocator,args,args_1);
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,int,cs_impl::any::holder<cs::type_t>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,&local_24,&local_28,&local_20);
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make_protect(ArgsT &&...args)
		{
			return any(allocator.alloc(1, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}